

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_heap_dbl(REF_INT n,REF_DBL *original,REF_INT *sorted_index)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar2 = _DAT_002170d0;
  if (0 < n) {
    lVar5 = (ulong)(uint)n - 1;
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_002170d0;
    auVar12 = _DAT_002170c0;
    do {
      auVar13 = auVar12 ^ auVar2;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        sorted_index[uVar6] = (int)uVar6;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        sorted_index[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar5 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar6);
    if (n != 1) {
      uVar7 = n - 1;
      uVar6 = (ulong)(((uint)n >> 1) + 1);
      do {
        if ((int)uVar6 < 2) {
          iVar4 = sorted_index[uVar7];
          dVar1 = original[iVar4];
          sorted_index[uVar7] = *sorted_index;
          uVar3 = 1;
          uVar7 = uVar7 - 1;
          if (uVar7 == 0) {
            *sorted_index = iVar4;
            return 0;
          }
        }
        else {
          uVar3 = (ulong)((int)uVar6 - 1);
          iVar4 = sorted_index[uVar6 - 2];
          dVar1 = original[iVar4];
        }
        iVar8 = (int)uVar3 + -1;
        iVar10 = (int)uVar3 * 2 + -1;
        if (iVar10 <= (int)uVar7) {
          do {
            lVar5 = (long)iVar10;
            iVar9 = iVar10;
            if ((iVar10 < (int)uVar7) &&
               (original[sorted_index[lVar5]] <= original[sorted_index[lVar5 + 1]] &&
                original[sorted_index[lVar5 + 1]] != original[sorted_index[lVar5]])) {
              lVar5 = lVar5 + 1;
              iVar9 = iVar10 + 1;
            }
            if (original[sorted_index[lVar5]] <= dVar1) break;
            sorted_index[iVar8] = sorted_index[lVar5];
            iVar10 = iVar9 * 2 + 1;
            iVar8 = iVar9;
          } while (iVar9 * 2 < (int)uVar7);
        }
        sorted_index[iVar8] = iVar4;
        uVar6 = uVar3;
      } while( true );
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_dbl(REF_INT n, REF_DBL *original,
                                     REF_INT *sorted_index) {
  REF_INT i, j, l, ir, indxt;
  REF_DBL q;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}